

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

void __thiscall
HeadersSyncState::HeadersSyncState
          (HeadersSyncState *this,NodeId id,Params *consensus_params,CBlockIndex *chain_start,
          arith_uint256 *minimum_required_work)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  uint uVar2;
  LogFlags flag;
  rep rVar3;
  char *in_RCX;
  size_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  char *in_RSI;
  uint *in_RDI;
  size_t in_R8;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe2c;
  base_uint<256U> *in_stack_fffffffffffffe30;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  CBlockIndex *in_stack_fffffffffffffe48;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffe50;
  SaltedTxidHasher *in_stack_fffffffffffffe58;
  int source_line;
  ConstevalFormatString<4U> in_stack_fffffffffffffed8;
  Level in_stack_ffffffffffffffd0;
  long *in_stack_ffffffffffffffe0;
  long *in_stack_ffffffffffffffe8;
  unsigned_long *args_2;
  
  args_2 = *(unsigned_long **)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_fffffffffffffe38.__r,
             SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
  uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                    (in_stack_fffffffffffffe50,(uint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  *in_RDI = uVar2;
  *(char **)(in_RDI + 2) = in_RSI;
  *(size_t *)(in_RDI + 4) = in_RDX;
  *(char **)(in_RDI + 6) = in_RCX;
  arith_uint256::arith_uint256
            ((arith_uint256 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (arith_uint256 *)0xf3892f);
  arith_uint256::arith_uint256
            ((arith_uint256 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (arith_uint256 *)0xf3894c);
  SaltedTxidHasher::SaltedTxidHasher(in_stack_fffffffffffffe58);
  bitdeque<32768>::bitdeque
            ((bitdeque<32768> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  CBlockIndex::GetBlockHeader((CBlockIndex *)in_stack_fffffffffffffe38.__r);
  *(long *)(in_RDI + 0x48) = (long)*(int *)(in_RCX + 0x18);
  source_line = (int)((ulong)(in_RDI + 0x4a) >> 0x20);
  std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::deque
            ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  in_RDI[0x5e] = 0;
  in_RDI[0x5f] = 0;
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  arith_uint256::arith_uint256
            ((arith_uint256 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  *(undefined1 *)(in_RDI + 0x78) = 0;
  in_RDI[0x79] = 0;
  NodeClock::now();
  flag = CBlockIndex::GetMedianTimePast(in_stack_fffffffffffffe48);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(long *)0xf38a75);
  std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::time_point
            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),(duration *)0xf38a8c);
  std::chrono::operator-
            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
             in_stack_fffffffffffffe30,
             (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  rVar3 = Ticks<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (in_stack_fffffffffffffe38);
  *(ulong *)(in_RDI + 0x32) = (ulong)((rVar3 + 0x1c20) * 6) / 0x267;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    base_uint<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe30);
    uVar4 = 1;
    logging_function._M_str = in_RSI;
    logging_function._M_len = in_RDX;
    source_file._M_str = in_RCX;
    source_file._M_len = in_R8;
    LogPrintFormatInternal<long,long,unsigned_long,std::__cxx11::string>
              (logging_function,source_file,source_line,flag,in_stack_ffffffffffffffd0,
               in_stack_fffffffffffffed8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,args_2,
               unaff_RBX);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,uVar4));
  }
  if (*(unsigned_long **)(in_FS_OFFSET + 0x28) != args_2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

HeadersSyncState::HeadersSyncState(NodeId id, const Consensus::Params& consensus_params,
        const CBlockIndex* chain_start, const arith_uint256& minimum_required_work) :
    m_commit_offset(FastRandomContext().randrange<unsigned>(HEADER_COMMITMENT_PERIOD)),
    m_id(id), m_consensus_params(consensus_params),
    m_chain_start(chain_start),
    m_minimum_required_work(minimum_required_work),
    m_current_chain_work(chain_start->nChainWork),
    m_last_header_received(m_chain_start->GetBlockHeader()),
    m_current_height(chain_start->nHeight)
{
    // Estimate the number of blocks that could possibly exist on the peer's
    // chain *right now* using 6 blocks/second (fastest blockrate given the MTP
    // rule) times the number of seconds from the last allowed block until
    // today. This serves as a memory bound on how many commitments we might
    // store from this peer, and we can safely give up syncing if the peer
    // exceeds this bound, because it's not possible for a consensus-valid
    // chain to be longer than this (at the current time -- in the future we
    // could try again, if necessary, to sync a longer chain).
    m_max_commitments = 6*(Ticks<std::chrono::seconds>(NodeClock::now() - NodeSeconds{std::chrono::seconds{chain_start->GetMedianTimePast()}}) + MAX_FUTURE_BLOCK_TIME) / HEADER_COMMITMENT_PERIOD;

    LogDebug(BCLog::NET, "Initial headers sync started with peer=%d: height=%i, max_commitments=%i, min_work=%s\n", m_id, m_current_height, m_max_commitments, m_minimum_required_work.ToString());
}